

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O0

void __thiscall bloaty::dwarf::CU::ReadTopLevelDIE(CU *this,InfoReader *reader)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  mapped_type *this_00;
  Abbrev *in_RSI;
  CU *in_RDI;
  DIEReader *unaff_retaddr;
  iterator iter;
  optional<unsigned_long> stmt_list;
  Abbrev *abbrev;
  DIEReader die_reader;
  unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff78;
  pointer *this_01;
  CU *in_stack_ffffffffffffff90;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_60;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_58 [2];
  undefined1 *local_48;
  undefined1 local_40 [16];
  Abbrev *local_30;
  anon_class_16_2_63989322 *in_stack_ffffffffffffffe8;
  CU *cu;
  
  cu = in_RDI;
  GetDIEReader(in_stack_ffffffffffffff90);
  local_30 = DIEReader::ReadCode((DIEReader *)in_RDI,in_stack_ffffffffffffff90);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x2179c9);
  std::__cxx11::string::clear();
  local_48 = local_40;
  DIEReader::ReadAttributes<bloaty::dwarf::CU::ReadTopLevelDIE(bloaty::dwarf::InfoReader&)::__0>
            (unaff_retaddr,cu,in_RSI,in_stack_ffffffffffffffe8);
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x217a09);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_01 = &(in_RSI->attr).
                 super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x217abf);
      this_00 = std::
                unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)this_01,(key_type *)in_stack_ffffffffffffff78);
      std::__cxx11::string::operator=((string *)this_00,(string *)&in_RDI->unit_name_);
    }
    else {
      std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x217a3e);
      local_58[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(in_stack_ffffffffffffff78,(key_type *)0x217a4b);
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(in_stack_ffffffffffffff78);
      bVar1 = std::__detail::operator!=(local_58,&local_60);
      if (bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                               *)0x217a82);
        std::__cxx11::string::operator=((string *)&in_RDI->unit_name_,(string *)&ppVar3->second);
      }
    }
  }
  return;
}

Assistant:

void CU::ReadTopLevelDIE(InfoReader& reader) {
  DIEReader die_reader = GetDIEReader();
  const auto* abbrev = die_reader.ReadCode(*this);
  absl::optional<uint64_t> stmt_list;
  unit_name_.clear();
  die_reader.ReadAttributes(
      *this, abbrev, [this, &stmt_list](uint16_t tag, dwarf::AttrValue value) {
        switch (tag) {
          case DW_AT_name:
            if (value.IsString()) {
              unit_name_ = std::string(value.GetString(*this));
            }
            break;
          case DW_AT_stmt_list:
            if (value.form() == DW_FORM_sec_offset) {
              stmt_list = value.GetUint(*this);
            }
            break;
          case DW_AT_addr_base:
          case DW_AT_GNU_addr_base:
            if (value.form() == DW_FORM_sec_offset) {
              addr_base_ = value.GetUint(*this);
            }
            break;
          case DW_AT_str_offsets_base:
            if (value.form() == DW_FORM_sec_offset) {
              str_offsets_base_ = value.GetUint(*this);
            }
            break;
          case DW_AT_rnglists_base:
            if (value.form() == DW_FORM_sec_offset) {
              range_lists_base_ = value.GetUint(*this);
            }
            break;
          case DW_AT_GNU_dwo_id:
            if (value.IsUint()) {
              dwo_id_ = value.GetUint(*this);
            }
        }
      });

  if (stmt_list) {
    if (unit_name_.empty()) {
      auto iter = reader.stmt_list_map_.find(*stmt_list);
      if (iter != reader.stmt_list_map_.end()) {
        unit_name_ = iter->second;
      }
    } else {
      (reader.stmt_list_map_)[*stmt_list] = unit_name_;
    }
  }
}